

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn_reader.c
# Opt level: O0

RNNModel * rnnoise_model_from_file(FILE *f)

{
  int iVar1;
  FILE *model;
  DenseLayer *pDVar2;
  GRULayer *pGVar3;
  GRULayer *pGVar4;
  GRULayer *pGVar5;
  DenseLayer *pDVar6;
  DenseLayer *pDVar7;
  rnn_weight *prVar8;
  rnn_weight *values_14;
  rnn_weight *values_13;
  int activation_5;
  rnn_weight *values_12;
  rnn_weight *values_11;
  int activation_4;
  rnn_weight *values_10;
  rnn_weight *values_9;
  rnn_weight *values_8;
  int activation_3;
  rnn_weight *values_7;
  rnn_weight *values_6;
  rnn_weight *values_5;
  int activation_2;
  rnn_weight *values_4;
  rnn_weight *values_3;
  rnn_weight *values_2;
  int activation_1;
  rnn_weight *values_1;
  rnn_weight *values;
  int activation;
  DenseLayer *vad_output;
  DenseLayer *denoise_output;
  GRULayer *denoise_gru;
  GRULayer *noise_gru;
  GRULayer *vad_gru;
  DenseLayer *input_dense;
  RNNModel *ret;
  int in;
  int i;
  FILE *f_local;
  
  _in = f;
  iVar1 = __isoc99_fscanf(f,"rnnoise-nu model file version %d\n",&ret);
  if ((iVar1 == 1) && ((int)ret == 1)) {
    model = (FILE *)calloc(1,0x60);
    if (model == (FILE *)0x0) {
      f_local = (FILE *)0x0;
    }
    else {
      pDVar2 = (DenseLayer *)calloc(1,0x20);
      if (pDVar2 == (DenseLayer *)0x0) {
        rnnoise_model_free((RNNModel *)model);
        f_local = (FILE *)0x0;
      }
      else {
        model->_IO_read_ptr = (char *)pDVar2;
        pGVar3 = (GRULayer *)calloc(1,0x28);
        if (pGVar3 == (GRULayer *)0x0) {
          rnnoise_model_free((RNNModel *)model);
          f_local = (FILE *)0x0;
        }
        else {
          model->_IO_read_base = (char *)pGVar3;
          pGVar4 = (GRULayer *)calloc(1,0x28);
          if (pGVar4 == (GRULayer *)0x0) {
            rnnoise_model_free((RNNModel *)model);
            f_local = (FILE *)0x0;
          }
          else {
            model->_IO_write_ptr = (char *)pGVar4;
            pGVar5 = (GRULayer *)calloc(1,0x28);
            if (pGVar5 == (GRULayer *)0x0) {
              rnnoise_model_free((RNNModel *)model);
              f_local = (FILE *)0x0;
            }
            else {
              model->_IO_buf_base = (char *)pGVar5;
              pDVar6 = (DenseLayer *)calloc(1,0x20);
              if (pDVar6 == (DenseLayer *)0x0) {
                rnnoise_model_free((RNNModel *)model);
                f_local = (FILE *)0x0;
              }
              else {
                model->_IO_save_base = (char *)pDVar6;
                pDVar7 = (DenseLayer *)calloc(1,0x20);
                if (pDVar7 == (DenseLayer *)0x0) {
                  rnnoise_model_free((RNNModel *)model);
                  f_local = (FILE *)0x0;
                }
                else {
                  model->_IO_save_end = (char *)pDVar7;
                  iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                  if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                    pDVar2->nb_inputs = (int)ret;
                    iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                    if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                      pDVar2->nb_neurons = (int)ret;
                      model->_flags = pDVar2->nb_neurons;
                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                      if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                        if ((int)ret == 1) {
                          pDVar2->activation = 1;
                        }
                        else if ((int)ret == 2) {
                          pDVar2->activation = 2;
                        }
                        else {
                          pDVar2->activation = 0;
                        }
                        prVar8 = (rnn_weight *)
                                 malloc((long)(pDVar2->nb_inputs * pDVar2->nb_neurons));
                        if (prVar8 == (rnn_weight *)0x0) {
                          rnnoise_model_free((RNNModel *)model);
                          f_local = (FILE *)0x0;
                        }
                        else {
                          pDVar2->input_weights = prVar8;
                          for (ret._4_4_ = 0; ret._4_4_ < pDVar2->nb_inputs * pDVar2->nb_neurons;
                              ret._4_4_ = ret._4_4_ + 1) {
                            iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                            if (iVar1 != 1) {
                              rnnoise_model_free((RNNModel *)model);
                              return (RNNModel *)0x0;
                            }
                            prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                          }
                          prVar8 = (rnn_weight *)malloc((long)pDVar2->nb_neurons);
                          if (prVar8 == (rnn_weight *)0x0) {
                            rnnoise_model_free((RNNModel *)model);
                            f_local = (FILE *)0x0;
                          }
                          else {
                            pDVar2->bias = prVar8;
                            for (ret._4_4_ = 0; ret._4_4_ < pDVar2->nb_neurons;
                                ret._4_4_ = ret._4_4_ + 1) {
                              iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                              if (iVar1 != 1) {
                                rnnoise_model_free((RNNModel *)model);
                                return (RNNModel *)0x0;
                              }
                              prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                            }
                            iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                            if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                              pGVar3->nb_inputs = (int)ret;
                              iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                              if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                                pGVar3->nb_neurons = (int)ret;
                                *(int *)&model->_IO_read_end = pGVar3->nb_neurons;
                                iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)) {
                                  if ((int)ret == 1) {
                                    pGVar3->activation = 1;
                                  }
                                  else if ((int)ret == 2) {
                                    pGVar3->activation = 2;
                                  }
                                  else {
                                    pGVar3->activation = 0;
                                  }
                                  prVar8 = (rnn_weight *)
                                           malloc((long)(pGVar3->nb_inputs * pGVar3->nb_neurons * 3)
                                                 );
                                  if (prVar8 == (rnn_weight *)0x0) {
                                    rnnoise_model_free((RNNModel *)model);
                                    f_local = (FILE *)0x0;
                                  }
                                  else {
                                    pGVar3->input_weights = prVar8;
                                    for (ret._4_4_ = 0;
                                        iVar1 = pGVar3->nb_inputs * pGVar3->nb_neurons,
                                        SBORROW4(ret._4_4_,iVar1 * 3) != ret._4_4_ + iVar1 * -3 < 0;
                                        ret._4_4_ = ret._4_4_ + 1) {
                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                      if (iVar1 != 1) {
                                        rnnoise_model_free((RNNModel *)model);
                                        return (RNNModel *)0x0;
                                      }
                                      prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                    }
                                    prVar8 = (rnn_weight *)
                                             malloc((long)(pGVar3->nb_neurons * pGVar3->nb_neurons *
                                                          3));
                                    if (prVar8 == (rnn_weight *)0x0) {
                                      rnnoise_model_free((RNNModel *)model);
                                      f_local = (FILE *)0x0;
                                    }
                                    else {
                                      pGVar3->recurrent_weights = prVar8;
                                      for (ret._4_4_ = 0;
                                          iVar1 = pGVar3->nb_neurons * pGVar3->nb_neurons,
                                          SBORROW4(ret._4_4_,iVar1 * 3) !=
                                          ret._4_4_ + iVar1 * -3 < 0; ret._4_4_ = ret._4_4_ + 1) {
                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                        if (iVar1 != 1) {
                                          rnnoise_model_free((RNNModel *)model);
                                          return (RNNModel *)0x0;
                                        }
                                        prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                      }
                                      prVar8 = (rnn_weight *)malloc((long)(pGVar3->nb_neurons * 3));
                                      if (prVar8 == (rnn_weight *)0x0) {
                                        rnnoise_model_free((RNNModel *)model);
                                        f_local = (FILE *)0x0;
                                      }
                                      else {
                                        pGVar3->bias = prVar8;
                                        for (ret._4_4_ = 0;
                                            SBORROW4(ret._4_4_,pGVar3->nb_neurons * 3) !=
                                            ret._4_4_ + pGVar3->nb_neurons * -3 < 0;
                                            ret._4_4_ = ret._4_4_ + 1) {
                                          iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                          if (iVar1 != 1) {
                                            rnnoise_model_free((RNNModel *)model);
                                            return (RNNModel *)0x0;
                                          }
                                          prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                        }
                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                        if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81))
                                        {
                                          pGVar4->nb_inputs = (int)ret;
                                          iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                          if (((iVar1 == 1) && (-1 < (int)ret)) && ((int)ret < 0x81)
                                             ) {
                                            pGVar4->nb_neurons = (int)ret;
                                            *(int *)&model->_IO_write_base = pGVar4->nb_neurons;
                                            iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                            if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                               ((int)ret < 0x81)) {
                                              if ((int)ret == 1) {
                                                pGVar4->activation = 1;
                                              }
                                              else if ((int)ret == 2) {
                                                pGVar4->activation = 2;
                                              }
                                              else {
                                                pGVar4->activation = 0;
                                              }
                                              prVar8 = (rnn_weight *)
                                                       malloc((long)(pGVar4->nb_inputs *
                                                                     pGVar4->nb_neurons * 3));
                                              if (prVar8 == (rnn_weight *)0x0) {
                                                rnnoise_model_free((RNNModel *)model);
                                                f_local = (FILE *)0x0;
                                              }
                                              else {
                                                pGVar4->input_weights = prVar8;
                                                for (ret._4_4_ = 0;
                                                    iVar1 = pGVar4->nb_inputs * pGVar4->nb_neurons,
                                                    SBORROW4(ret._4_4_,iVar1 * 3) !=
                                                    ret._4_4_ + iVar1 * -3 < 0;
                                                    ret._4_4_ = ret._4_4_ + 1) {
                                                  iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                  if (iVar1 != 1) {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    return (RNNModel *)0x0;
                                                  }
                                                  prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                }
                                                prVar8 = (rnn_weight *)
                                                         malloc((long)(pGVar4->nb_neurons *
                                                                       pGVar4->nb_neurons * 3));
                                                if (prVar8 == (rnn_weight *)0x0) {
                                                  rnnoise_model_free((RNNModel *)model);
                                                  f_local = (FILE *)0x0;
                                                }
                                                else {
                                                  pGVar4->recurrent_weights = prVar8;
                                                  for (ret._4_4_ = 0;
                                                      iVar1 = pGVar4->nb_neurons *
                                                              pGVar4->nb_neurons,
                                                      SBORROW4(ret._4_4_,iVar1 * 3) !=
                                                      ret._4_4_ + iVar1 * -3 < 0;
                                                      ret._4_4_ = ret._4_4_ + 1) {
                                                    iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                    if (iVar1 != 1) {
                                                      rnnoise_model_free((RNNModel *)model);
                                                      return (RNNModel *)0x0;
                                                    }
                                                    prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                  }
                                                  prVar8 = (rnn_weight *)
                                                           malloc((long)(pGVar4->nb_neurons * 3));
                                                  if (prVar8 == (rnn_weight *)0x0) {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  else {
                                                    pGVar4->bias = prVar8;
                                                    for (ret._4_4_ = 0;
                                                        SBORROW4(ret._4_4_,pGVar4->nb_neurons * 3)
                                                        != ret._4_4_ + pGVar4->nb_neurons * -3 < 0;
                                                        ret._4_4_ = ret._4_4_ + 1) {
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (iVar1 != 1) {
                                                        rnnoise_model_free((RNNModel *)model);
                                                        return (RNNModel *)0x0;
                                                      }
                                                      prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                    }
                                                    iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                    if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                       ((int)ret < 0x81)) {
                                                      pGVar5->nb_inputs = (int)ret;
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                         ((int)ret < 0x81)) {
                                                        pGVar5->nb_neurons = (int)ret;
                                                        *(int *)&model->_IO_write_end =
                                                             pGVar5->nb_neurons;
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                           ((int)ret < 0x81)) {
                                                          if ((int)ret == 1) {
                                                            pGVar5->activation = 1;
                                                          }
                                                          else if ((int)ret == 2) {
                                                            pGVar5->activation = 2;
                                                          }
                                                          else {
                                                            pGVar5->activation = 0;
                                                          }
                                                          prVar8 = (rnn_weight *)
                                                                   malloc((long)(pGVar5->nb_inputs *
                                                                                 pGVar5->nb_neurons
                                                                                * 3));
                                                          if (prVar8 == (rnn_weight *)0x0) {
                                                            rnnoise_model_free((RNNModel *)model);
                                                            f_local = (FILE *)0x0;
                                                          }
                                                          else {
                                                            pGVar5->input_weights = prVar8;
                                                            for (ret._4_4_ = 0;
                                                                iVar1 = pGVar5->nb_inputs *
                                                                        pGVar5->nb_neurons,
                                                                SBORROW4(ret._4_4_,iVar1 * 3) !=
                                                                ret._4_4_ + iVar1 * -3 < 0;
                                                                ret._4_4_ = ret._4_4_ + 1) {
                                                              iVar1 = __isoc99_fscanf(_in,"%d",&ret)
                                                              ;
                                                              if (iVar1 != 1) {
                                                                rnnoise_model_free((RNNModel *)model
                                                                                  );
                                                                return (RNNModel *)0x0;
                                                              }
                                                              prVar8[ret._4_4_] =
                                                                   (rnn_weight)(int)ret;
                                                            }
                                                            prVar8 = (rnn_weight *)
                                                                     malloc((long)(pGVar5->
                                                  nb_neurons * pGVar5->nb_neurons * 3));
                                                  if (prVar8 == (rnn_weight *)0x0) {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  else {
                                                    pGVar5->recurrent_weights = prVar8;
                                                    for (ret._4_4_ = 0;
                                                        iVar1 = pGVar5->nb_neurons *
                                                                pGVar5->nb_neurons,
                                                        SBORROW4(ret._4_4_,iVar1 * 3) !=
                                                        ret._4_4_ + iVar1 * -3 < 0;
                                                        ret._4_4_ = ret._4_4_ + 1) {
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (iVar1 != 1) {
                                                        rnnoise_model_free((RNNModel *)model);
                                                        return (RNNModel *)0x0;
                                                      }
                                                      prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                    }
                                                    prVar8 = (rnn_weight *)
                                                             malloc((long)(pGVar5->nb_neurons * 3));
                                                    if (prVar8 == (rnn_weight *)0x0) {
                                                      rnnoise_model_free((RNNModel *)model);
                                                      f_local = (FILE *)0x0;
                                                    }
                                                    else {
                                                      pGVar5->bias = prVar8;
                                                      for (ret._4_4_ = 0;
                                                          SBORROW4(ret._4_4_,pGVar5->nb_neurons * 3)
                                                          != ret._4_4_ + pGVar5->nb_neurons * -3 < 0
                                                          ; ret._4_4_ = ret._4_4_ + 1) {
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (iVar1 != 1) {
                                                          rnnoise_model_free((RNNModel *)model);
                                                          return (RNNModel *)0x0;
                                                        }
                                                        prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                      }
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                         ((int)ret < 0x81)) {
                                                        pDVar6->nb_inputs = (int)ret;
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                           ((int)ret < 0x81)) {
                                                          pDVar6->nb_neurons = (int)ret;
                                                          *(int *)&model->_IO_buf_end =
                                                               pDVar6->nb_neurons;
                                                          iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                          if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                             ((int)ret < 0x81)) {
                                                            if ((int)ret == 1) {
                                                              pDVar6->activation = 1;
                                                            }
                                                            else if ((int)ret == 2) {
                                                              pDVar6->activation = 2;
                                                            }
                                                            else {
                                                              pDVar6->activation = 0;
                                                            }
                                                            prVar8 = (rnn_weight *)
                                                                     malloc((long)(pDVar6->nb_inputs
                                                                                  * pDVar6->
                                                  nb_neurons));
                                                  if (prVar8 == (rnn_weight *)0x0) {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  else {
                                                    pDVar6->input_weights = prVar8;
                                                    for (ret._4_4_ = 0;
                                                        ret._4_4_ <
                                                        pDVar6->nb_inputs * pDVar6->nb_neurons;
                                                        ret._4_4_ = ret._4_4_ + 1) {
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (iVar1 != 1) {
                                                        rnnoise_model_free((RNNModel *)model);
                                                        return (RNNModel *)0x0;
                                                      }
                                                      prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                    }
                                                    prVar8 = (rnn_weight *)
                                                             malloc((long)pDVar6->nb_neurons);
                                                    if (prVar8 == (rnn_weight *)0x0) {
                                                      rnnoise_model_free((RNNModel *)model);
                                                      f_local = (FILE *)0x0;
                                                    }
                                                    else {
                                                      pDVar6->bias = prVar8;
                                                      for (ret._4_4_ = 0;
                                                          ret._4_4_ < pDVar6->nb_neurons;
                                                          ret._4_4_ = ret._4_4_ + 1) {
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (iVar1 != 1) {
                                                          rnnoise_model_free((RNNModel *)model);
                                                          return (RNNModel *)0x0;
                                                        }
                                                        prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                      }
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                         ((int)ret < 0x81)) {
                                                        pDVar7->nb_inputs = (int)ret;
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                           ((int)ret < 0x81)) {
                                                          pDVar7->nb_neurons = (int)ret;
                                                          *(int *)&model->_IO_backup_base =
                                                               pDVar7->nb_neurons;
                                                          iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                          if (((iVar1 == 1) && (-1 < (int)ret)) &&
                                                             ((int)ret < 0x81)) {
                                                            if ((int)ret == 1) {
                                                              pDVar7->activation = 1;
                                                            }
                                                            else if ((int)ret == 2) {
                                                              pDVar7->activation = 2;
                                                            }
                                                            else {
                                                              pDVar7->activation = 0;
                                                            }
                                                            prVar8 = (rnn_weight *)
                                                                     malloc((long)(pDVar7->nb_inputs
                                                                                  * pDVar7->
                                                  nb_neurons));
                                                  if (prVar8 == (rnn_weight *)0x0) {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  else {
                                                    pDVar7->input_weights = prVar8;
                                                    for (ret._4_4_ = 0;
                                                        ret._4_4_ <
                                                        pDVar7->nb_inputs * pDVar7->nb_neurons;
                                                        ret._4_4_ = ret._4_4_ + 1) {
                                                      iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                      if (iVar1 != 1) {
                                                        rnnoise_model_free((RNNModel *)model);
                                                        return (RNNModel *)0x0;
                                                      }
                                                      prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                    }
                                                    prVar8 = (rnn_weight *)
                                                             malloc((long)pDVar7->nb_neurons);
                                                    if (prVar8 == (rnn_weight *)0x0) {
                                                      rnnoise_model_free((RNNModel *)model);
                                                      f_local = (FILE *)0x0;
                                                    }
                                                    else {
                                                      pDVar7->bias = prVar8;
                                                      for (ret._4_4_ = 0; f_local = model,
                                                          ret._4_4_ < pDVar7->nb_neurons;
                                                          ret._4_4_ = ret._4_4_ + 1) {
                                                        iVar1 = __isoc99_fscanf(_in,"%d",&ret);
                                                        if (iVar1 != 1) {
                                                          rnnoise_model_free((RNNModel *)model);
                                                          return (RNNModel *)0x0;
                                                        }
                                                        prVar8[ret._4_4_] = (rnn_weight)(int)ret;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                  else {
                                                    rnnoise_model_free((RNNModel *)model);
                                                    f_local = (FILE *)0x0;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              rnnoise_model_free((RNNModel *)model);
                                              f_local = (FILE *)0x0;
                                            }
                                          }
                                          else {
                                            rnnoise_model_free((RNNModel *)model);
                                            f_local = (FILE *)0x0;
                                          }
                                        }
                                        else {
                                          rnnoise_model_free((RNNModel *)model);
                                          f_local = (FILE *)0x0;
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  rnnoise_model_free((RNNModel *)model);
                                  f_local = (FILE *)0x0;
                                }
                              }
                              else {
                                rnnoise_model_free((RNNModel *)model);
                                f_local = (FILE *)0x0;
                              }
                            }
                            else {
                              rnnoise_model_free((RNNModel *)model);
                              f_local = (FILE *)0x0;
                            }
                          }
                        }
                      }
                      else {
                        rnnoise_model_free((RNNModel *)model);
                        f_local = (FILE *)0x0;
                      }
                    }
                    else {
                      rnnoise_model_free((RNNModel *)model);
                      f_local = (FILE *)0x0;
                    }
                  }
                  else {
                    rnnoise_model_free((RNNModel *)model);
                    f_local = (FILE *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    f_local = (FILE *)0x0;
  }
  return (RNNModel *)f_local;
}

Assistant:

RNNModel *rnnoise_model_from_file(FILE *f) {
    int i, in;

    if (fscanf(f, "rnnoise-nu model file version %d\n", &in) != 1 || in != 1)
        return NULL;

    RNNModel *ret = calloc(1, sizeof(RNNModel));
    if (!ret)
        return NULL;

#define ALLOC_LAYER(type, name) \
    type *name; \
    name = calloc(1, sizeof(type)); \
    if (!name) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    ret->name = name

    ALLOC_LAYER(DenseLayer, input_dense);
    ALLOC_LAYER(GRULayer, vad_gru);
    ALLOC_LAYER(GRULayer, noise_gru);
    ALLOC_LAYER(GRULayer, denoise_gru);
    ALLOC_LAYER(DenseLayer, denoise_output);
    ALLOC_LAYER(DenseLayer, vad_output);

#define INPUT_VAL(name) do { \
    if (fscanf(f, "%d", &in) != 1 || in < 0 || in > 128) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = in; \
    } while (0)

#define INPUT_ACTIVATION(name) do { \
    int activation; \
    INPUT_VAL(activation); \
    switch (activation) { \
        case F_ACTIVATION_SIGMOID: \
            name = ACTIVATION_SIGMOID; \
            break; \
        case F_ACTIVATION_RELU: \
            name = ACTIVATION_RELU; \
            break; \
        default: \
            name = ACTIVATION_TANH; \
    } \
    } while (0)

#define INPUT_ARRAY(name, len) do { \
    rnn_weight *values = malloc((len) * sizeof(rnn_weight)); \
    if (!values) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = values; \
    for (i = 0; i < (len); i++) { \
        if (fscanf(f, "%d", &in) != 1) { \
            rnnoise_model_free(ret); \
            return NULL; \
        } \
        values[i] = in; \
    } \
    } while (0)

#define INPUT_DENSE(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons); \
    INPUT_ARRAY(name->bias, name->nb_neurons); \
    } while (0)

#define INPUT_GRU(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons * 3); \
    INPUT_ARRAY(name->recurrent_weights, name->nb_neurons * name->nb_neurons * 3); \
    INPUT_ARRAY(name->bias, name->nb_neurons * 3); \
    } while (0)

    INPUT_DENSE(input_dense);
    INPUT_GRU(vad_gru);
    INPUT_GRU(noise_gru);
    INPUT_GRU(denoise_gru);
    INPUT_DENSE(denoise_output);
    INPUT_DENSE(vad_output);

    return ret;
}